

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O0

bool duckdb::IntegerDecimalCastOperation::
     Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,_true>
               (IntegerDecimalCastData<unsigned_short> *state)

{
  bool bVar1;
  ulong *in_RDI;
  bool success;
  result_t tmp;
  uint16_t *in_stack_ffffffffffffffd8;
  ulong *in_stack_ffffffffffffffe0;
  bool bStack_13;
  ushort uStack_12;
  bool bStack_1;
  
  bVar1 = TryCast::Operation<long,_unsigned_short>
                    ((int64_t)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,false);
  if (bVar1) {
    while (10 < (long)in_RDI[1]) {
      in_RDI[1] = (long)in_RDI[1] / 10;
      *(short *)(in_RDI + 2) = (short)in_RDI[2] + -1;
      in_stack_ffffffffffffffe0 = in_RDI;
    }
    bStack_13 = true;
    if (((short)in_RDI[2] == 1) && (4 < (long)in_RDI[1])) {
      bStack_13 = TrySubtractOperator::Operation<unsigned_short,_unsigned_short,_unsigned_short>
                            ((uint16_t)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                             (uint16_t)((ulong)in_stack_ffffffffffffffe0 >> 0x10),
                             in_stack_ffffffffffffffd8);
    }
    *in_RDI = (ulong)uStack_12;
    bStack_1 = bStack_13;
  }
  else {
    bStack_1 = false;
  }
  return bStack_1;
}

Assistant:

static bool Finalize(T &state) {
		using result_t = typename T::ResultType;
		using store_t = typename T::StoreType;

		result_t tmp;
		if (!TryCast::Operation<store_t, result_t>(state.result, tmp)) {
			return false;
		}

		while (state.decimal > 10) {
			state.decimal /= 10;
			state.decimal_digits--;
		}

		bool success = true;
		if (state.decimal_digits == 1 && state.decimal >= 5) {
			if (NEGATIVE) {
				success = TrySubtractOperator::Operation(tmp, (result_t)1, tmp);
			} else {
				success = TryAddOperator::Operation(tmp, (result_t)1, tmp);
			}
		}
		state.result = tmp;
		return success;
	}